

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_vector_based.cpp
# Opt level: O2

void __thiscall
so_5::impl::vector_based_subscr_storage::storage_t::debug_dump(storage_t *this,ostream *to)

{
  pointer psVar1;
  char *pcVar2;
  ostream *poVar3;
  pointer psVar4;
  string local_50;
  
  psVar1 = (this->m_events).
           super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (this->m_events).
                super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    poVar3 = std::operator<<(to,"{");
    (*((psVar4->m_mbox).m_obj)->_vptr_abstract_message_box_t[2])();
    poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
    poVar3 = std::operator<<(poVar3,", ");
    pcVar2 = *(char **)((psVar4->m_msg_type)._M_target + 8);
    poVar3 = std::operator<<(poVar3,pcVar2 + (*pcVar2 == '*'));
    poVar3 = std::operator<<(poVar3,", ");
    state_t::query_name_abi_cxx11_(&local_50,psVar4->m_state);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    poVar3 = std::operator<<(poVar3,"}");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void
storage_t::debug_dump( std::ostream & to ) const
	{
		for( const auto & e : m_events )
			to << "{" << e.m_mbox->id() << ", "
					<< e.m_msg_type.name() << ", "
					<< e.m_state->query_name() << "}"
					<< std::endl;
	}